

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

ProStringList * prepareBuiltinArgs(ProStringList *__return_storage_ptr__,QList<ProStringList> *args)

{
  long lVar1;
  ProStringList *arg;
  ProStringList *this;
  long in_FS_OFFSET;
  QString local_78;
  ProString local_60;
  ProStringList *local_30;
  
  local_30 = *(ProStringList **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  QList<ProString>::reserve(&__return_storage_ptr__->super_QList<ProString>,(args->d).size);
  lVar1 = (args->d).size;
  if (lVar1 != 0) {
    this = (args->d).ptr;
    lVar1 = lVar1 * 0x18;
    do {
      ProStringList::join(&local_78,this,(QChar)0x20);
      ProString::ProString(&local_60,&local_78);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super_QList<ProString>).d.size,&local_60);
      QList<ProString>::end(&__return_storage_ptr__->super_QList<ProString>);
      if (&(local_60.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_60.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_60.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      this = this + 1;
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != 0);
  }
  if (*(ProStringList **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(ProStringList **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static ProStringList prepareBuiltinArgs(const QList<ProStringList> &args)
{
    ProStringList ret;
    ret.reserve(args.size());
    for (const ProStringList &arg : args)
        ret << arg.join(' ');
    return ret;
}